

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O0

Datatype * __thiscall TypeOpIntSright::getInputLocal(TypeOpIntSright *this,PcodeOp *op,int4 slot)

{
  TypeFactory *this_00;
  int4 s;
  Varnode *this_01;
  int4 slot_local;
  PcodeOp *op_local;
  TypeOpIntSright *this_local;
  
  if (slot == 1) {
    this_00 = (this->super_TypeOpBinary).super_TypeOp.tlst;
    this_01 = PcodeOp::getIn(op,1);
    s = Varnode::getSize(this_01);
    this_local = (TypeOpIntSright *)TypeFactory::getBaseNoChar(this_00,s,TYPE_INT);
  }
  else {
    this_local = (TypeOpIntSright *)TypeOpBinary::getInputLocal(&this->super_TypeOpBinary,op,slot);
  }
  return (Datatype *)this_local;
}

Assistant:

Datatype *TypeOpIntSright::getInputLocal(const PcodeOp *op,int4 slot) const

{
  if (slot==1)
    return tlst->getBaseNoChar(op->getIn(1)->getSize(),TYPE_INT);
  return TypeOpBinary::getInputLocal(op,slot);
}